

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall
QWidgetTextControlPrivate::contextMenuEvent
          (QWidgetTextControlPrivate *this,QPoint *screenPos,QPointF *docPos,QWidget *contextWidget)

{
  QWidget *this_00;
  QWidget *pQVar1;
  QWindow *pQVar2;
  QObject *ptr;
  QTLWExtra *pQVar3;
  
  this_00 = &QWidgetTextControl::createStandardContextMenu
                       (*(QWidgetTextControl **)&this->field_0x8,docPos,contextWidget)->
             super_QWidget;
  if (this_00 != (QWidget *)0x0) {
    QWidget::setAttribute(this_00,WA_DeleteOnClose,true);
    pQVar1 = *(QWidget **)&this->field_0x10;
    if ((pQVar1 != (QWidget *)0x0) && ((*(byte *)(*(long *)&pQVar1->field_0x8 + 0x30) & 1) != 0)) {
      pQVar1 = QWidget::window(pQVar1);
      pQVar2 = QWidget::windowHandle(pQVar1);
      if (pQVar2 != (QWindow *)0x0) {
        ptr = (QObject *)QWindow::screen();
        pQVar3 = QWidgetPrivate::topData(*(QWidgetPrivate **)&this_00->field_0x8);
        QWeakPointer<QObject>::assign<QObject>(&(pQVar3->initialScreen).wp,ptr);
      }
    }
    QMenu::popup((QMenu *)this_00,screenPos,(QAction *)0x0);
    return;
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::contextMenuEvent(const QPoint &screenPos, const QPointF &docPos, QWidget *contextWidget)
{
#ifdef QT_NO_CONTEXTMENU
    Q_UNUSED(screenPos);
    Q_UNUSED(docPos);
    Q_UNUSED(contextWidget);
#else
    Q_Q(QWidgetTextControl);
    QMenu *menu = q->createStandardContextMenu(docPos, contextWidget);
    if (!menu)
        return;
    menu->setAttribute(Qt::WA_DeleteOnClose);

    if (auto *widget = qobject_cast<QWidget *>(parent)) {
        if (auto *window = widget->window()->windowHandle())
            QMenuPrivate::get(menu)->topData()->initialScreen = window->screen();
    }

    menu->popup(screenPos);
#endif
}